

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::PerformOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  Type *pTVar1;
  Type *type;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined4 extraout_var_01;
  Constant *pCVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Constant *input2_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Instruction *this;
  undefined4 extraout_var_07;
  uint uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  value_type_conflict3 local_84;
  Constant *local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Type *local_58;
  long local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long lVar4;
  
  if ((input1 == (Constant *)0x0) || (input2 == (Constant *)0x0)) {
    __assert_fail("input1 && input2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x288,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  pTVar1 = input1->type_;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*pTVar1->_vptr_Type[0xe])(pTVar1);
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 == 0) {
    iVar2 = (*pTVar1->_vptr_Type[0xc])(pTVar1);
    if (CONCAT44(extraout_var_06,iVar2) == 0) {
      iVar2 = (*pTVar1->_vptr_Type[10])(pTVar1);
      if (CONCAT44(extraout_var_07,iVar2) == 0) {
        __assert_fail("type->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x2b3,
                      "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                     );
      }
      uVar3 = PerformIntegerOperation(const_mgr,opcode,input1,input2);
    }
    else {
      uVar3 = PerformFloatingPointOperation(const_mgr,opcode,input1,input2);
    }
  }
  else {
    type = *(Type **)(lVar4 + 0x28);
    local_80 = input2;
    local_58 = pTVar1;
    local_50 = lVar4;
    for (uVar7 = 0; uVar7 != *(uint *)(local_50 + 0x30); uVar7 = uVar7 + 1) {
      local_84 = 0;
      iVar2 = (*input1->_vptr_Constant[0x13])(input1);
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
      if (plVar5 == (long *)0x0) {
        iVar2 = (*input1->_vptr_Constant[0x16])(input1);
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          __assert_fail("input1->AsNullConstant()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x295,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pCVar6 = analysis::ConstantManager::GetConstant
                           (const_mgr,type,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
        input2 = local_80;
      }
      else {
        plVar5 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
        pCVar6 = *(Constant **)(*plVar5 + (ulong)uVar7 * 8);
      }
      iVar2 = (*input2->_vptr_Constant[0x13])(input2);
      plVar5 = (long *)CONCAT44(extraout_var_02,iVar2);
      if (plVar5 == (long *)0x0) {
        iVar2 = (*input2->_vptr_Constant[0x16])(input2);
        if (CONCAT44(extraout_var_03,iVar2) == 0) {
          __assert_fail("input2->AsNullConstant()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x29e,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        input2_00 = analysis::ConstantManager::GetConstant
                              (const_mgr,type,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
        input2 = local_80;
      }
      else {
        plVar5 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
        input2_00 = *(Constant **)(*plVar5 + (ulong)uVar7 * 8);
      }
      iVar2 = (*type->_vptr_Type[0xc])(type);
      if (CONCAT44(extraout_var_04,iVar2) == 0) {
        iVar2 = (*type->_vptr_Type[10])(type);
        if (CONCAT44(extraout_var_05,iVar2) == 0) {
          __assert_fail("ele_type->AsInteger()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x2a6,
                        "uint32_t spvtools::opt::(anonymous namespace)::PerformOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                       );
        }
        local_84 = PerformIntegerOperation(const_mgr,opcode,pCVar6,input2_00);
      }
      else {
        local_84 = PerformFloatingPointOperation(const_mgr,opcode,pCVar6,input2_00);
      }
      if (local_84 == 0) {
        uVar3 = 0;
        goto LAB_001e8b9b;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_84);
    }
    pCVar6 = analysis::ConstantManager::GetConstant
                       (const_mgr,local_58,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    this = analysis::ConstantManager::GetDefiningInstruction
                     (const_mgr,pCVar6,0,(inst_iterator *)0x0);
    uVar3 = Instruction::result_id(this);
  }
LAB_001e8b9b:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return uVar3;
}

Assistant:

uint32_t PerformOperation(analysis::ConstantManager* const_mgr, spv::Op opcode,
                          const analysis::Constant* input1,
                          const analysis::Constant* input2) {
  assert(input1 && input2);
  const analysis::Type* type = input1->type();
  std::vector<uint32_t> words;
  if (const analysis::Vector* vector_type = type->AsVector()) {
    const analysis::Type* ele_type = vector_type->element_type();
    for (uint32_t i = 0; i != vector_type->element_count(); ++i) {
      uint32_t id = 0;

      const analysis::Constant* input1_comp = nullptr;
      if (const analysis::VectorConstant* input1_vector =
              input1->AsVectorConstant()) {
        input1_comp = input1_vector->GetComponents()[i];
      } else {
        assert(input1->AsNullConstant());
        input1_comp = const_mgr->GetConstant(ele_type, {});
      }

      const analysis::Constant* input2_comp = nullptr;
      if (const analysis::VectorConstant* input2_vector =
              input2->AsVectorConstant()) {
        input2_comp = input2_vector->GetComponents()[i];
      } else {
        assert(input2->AsNullConstant());
        input2_comp = const_mgr->GetConstant(ele_type, {});
      }

      if (ele_type->AsFloat()) {
        id = PerformFloatingPointOperation(const_mgr, opcode, input1_comp,
                                           input2_comp);
      } else {
        assert(ele_type->AsInteger());
        id = PerformIntegerOperation(const_mgr, opcode, input1_comp,
                                     input2_comp);
      }
      if (id == 0) return 0;
      words.push_back(id);
    }
    const analysis::Constant* merged_const =
        const_mgr->GetConstant(type, words);
    return const_mgr->GetDefiningInstruction(merged_const)->result_id();
  } else if (type->AsFloat()) {
    return PerformFloatingPointOperation(const_mgr, opcode, input1, input2);
  } else {
    assert(type->AsInteger());
    return PerformIntegerOperation(const_mgr, opcode, input1, input2);
  }
}